

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations2Points1Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *P1,Matrix<float,_4,_1,_0,_4,_1> *P2
          ,Matrix<float,_4,_1,_0,_4,_1> *P1_B,Matrix<float,_4,_1,_0,_4,_1> *P2_B)

{
  XprTypeNested pMVar1;
  iterator __position;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> TVar6;
  Index inner;
  undefined8 *puVar7;
  undefined4 *puVar8;
  long lVar9;
  float fVar10;
  float fVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar16;
  float fVar17;
  RealScalar z_3;
  float fVar18;
  RealScalar z_1;
  float fVar19;
  RealScalar z;
  float fVar20;
  Matrix<float,_4,_4,_0,_4,_4> TP_B;
  Matrix<float,_4,_4,_0,_4,_4> TP;
  Matrix<float,_4,_4,_0,_4,_4> transU_B;
  Matrix<float,_4,_4,_0,_4,_4> transU;
  Matrix<float,_4,_4,_0,_4,_4> transV_B;
  Matrix<float,_4,_4,_0,_4,_4> transV;
  Matrix<float,_4,_1,_0,_4,_1> P2_B1;
  Matrix<float,_4,_1,_0,_4,_1> P2_1;
  undefined8 local_27c;
  float fStack_274;
  Matrix<float,_3,_1,_0,_3,_1> local_270;
  Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_260;
  undefined8 local_258;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  float local_1a8 [4];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168 [5];
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  undefined1 auStack_d0 [60];
  undefined1 auStack_94 [8];
  float fStack_8c;
  float local_88 [13];
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  puVar7 = &local_198;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  local_168[3] = 0.0;
  lVar9 = 0;
  do {
    *(undefined4 *)puVar7 = 0x3f800000;
    lVar9 = lVar9 + 0x10;
    puVar7 = (undefined8 *)((long)puVar7 + 0x14);
  } while (lVar9 != 0x40);
  lVar9 = 0;
  do {
    local_168[lVar9] =
         -(P1->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  puVar7 = &local_1d8;
  local_1a8[0] = 0.0;
  local_1a8[1] = 0.0;
  local_1a8[2] = 0.0;
  local_1a8[3] = 0.0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  lVar9 = 0;
  do {
    *(undefined4 *)puVar7 = 0x3f800000;
    lVar9 = lVar9 + 0x10;
    puVar7 = (undefined8 *)((long)puVar7 + 0x14);
  } while (lVar9 != 0x40);
  lVar9 = 0;
  do {
    local_1a8[lVar9] =
         -(P1_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  fVar10 = (P2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [0];
  fVar15 = (P2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [1];
  fVar16 = (P2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [2];
  fVar17 = (P2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [3];
  local_118 = (float)local_198;
  fStack_114 = local_198._4_4_;
  fStack_110 = (float)uStack_190;
  fStack_10c = uStack_190._4_4_;
  local_108 = (float)local_188;
  fStack_104 = local_188._4_4_;
  fStack_100 = (float)uStack_180;
  fStack_fc = uStack_180._4_4_;
  local_f8 = (float)local_178;
  fStack_f4 = local_178._4_4_;
  fStack_f0 = (float)uStack_170;
  fStack_ec = uStack_170._4_4_;
  local_e8 = local_168[0];
  fStack_e4 = local_168[1];
  fStack_e0 = local_168[2];
  fStack_dc = local_168[3];
  local_48 = fVar17 * local_168[0] +
             fVar16 * (float)local_178 + fVar15 * (float)local_188 + fVar10 * (float)local_198;
  fStack_44 = fVar17 * local_168[1] +
              fVar16 * local_178._4_4_ + fVar15 * local_188._4_4_ + fVar10 * local_198._4_4_;
  fStack_40 = fVar17 * local_168[2] +
              fVar16 * (float)uStack_170 + fVar15 * (float)uStack_180 + fVar10 * (float)uStack_190;
  fStack_3c = fVar17 * local_168[3] +
              fVar16 * uStack_170._4_4_ + fVar15 * uStack_180._4_4_ + fVar10 * uStack_190._4_4_;
  fVar10 = (P2_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[0];
  fVar15 = (P2_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[1];
  fVar16 = (P2_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[2];
  fVar17 = (P2_B->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
           array[3];
  local_168[4] = (float)local_1d8;
  fStack_154 = local_1d8._4_4_;
  fStack_150 = (float)uStack_1d0;
  fStack_14c = uStack_1d0._4_4_;
  local_148 = (float)local_1c8;
  fStack_144 = local_1c8._4_4_;
  fStack_140 = (float)uStack_1c0;
  fStack_13c = uStack_1c0._4_4_;
  local_138 = (float)local_1b8;
  fStack_134 = local_1b8._4_4_;
  fStack_130 = (float)uStack_1b0;
  fStack_12c = uStack_1b0._4_4_;
  local_128 = local_1a8[0];
  fStack_124 = local_1a8[1];
  fStack_120 = local_1a8[2];
  fStack_11c = local_1a8[3];
  local_88[0xc] =
       fVar17 * local_1a8[0] +
       fVar16 * (float)local_1b8 + fVar15 * (float)local_1c8 + fVar10 * (float)local_1d8;
  fStack_54 = fVar17 * local_1a8[1] +
              fVar16 * local_1b8._4_4_ + fVar15 * local_1c8._4_4_ + fVar10 * local_1d8._4_4_;
  fStack_50 = fVar17 * local_1a8[2] +
              fVar16 * (float)uStack_1b0 + fVar15 * (float)uStack_1c0 + fVar10 * (float)uStack_1d0;
  fStack_4c = fVar17 * local_1a8[3] +
              fVar16 * uStack_1b0._4_4_ + fVar15 * uStack_1c0._4_4_ + fVar10 * uStack_1d0._4_4_;
  puVar8 = (undefined4 *)(auStack_d0 + 0x38);
  auStack_d0._56_4_ = 0.0;
  auStack_94._0_4_ = 0.0;
  auStack_94._4_4_ = 0.0;
  fStack_8c = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  local_88[4] = 0.0;
  local_88[5] = 0.0;
  local_88[6] = 0.0;
  local_88[7] = 0.0;
  local_88[8] = 0.0;
  local_88[9] = 0.0;
  local_88[10] = 0.0;
  local_88[0xb] = 0.0;
  lVar9 = 0;
  do {
    *puVar8 = 0x3f800000;
    lVar9 = lVar9 + 0x10;
    puVar8 = puVar8 + 5;
  } while (lVar9 != 0x40);
  puVar8 = (undefined4 *)local_d8;
  auStack_d0._40_4_ = 0.0;
  auStack_d0._44_4_ = 0.0;
  auStack_d0._48_4_ = 0.0;
  auStack_d0._52_4_ = 0.0;
  auStack_d0._24_4_ = 0.0;
  auStack_d0._28_4_ = 0.0;
  auStack_d0._32_4_ = 0.0;
  auStack_d0._36_4_ = 0.0;
  auStack_d0._8_4_ = 0.0;
  auStack_d0._12_4_ = 0.0;
  auStack_d0._16_4_ = 0.0;
  auStack_d0._20_4_ = 0.0;
  local_d8._0_4_ = 0.0;
  local_d8._4_4_ = 0.0;
  auStack_d0._0_4_ = 0.0;
  auStack_d0._4_4_ = 0.0;
  lVar9 = 0;
  do {
    *puVar8 = 0x3f800000;
    lVar9 = lVar9 + 0x10;
    puVar8 = puVar8 + 5;
  } while (lVar9 != 0x40);
  local_218 = (undefined1  [8])&local_48;
  uStack_210 = 3;
  local_1f8 = 0;
  local_1e8 = 4;
  uStack_200 = (XprTypeNested)local_218;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            ((PlainObject *)&local_258,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             local_218);
  if (CONCAT44(fStack_244,local_248) != 3) {
LAB_0014d226:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<float, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, 3, 1>]"
                 );
  }
  local_27c._0_4_ = (float)local_258;
  local_27c._4_4_ = local_258._4_4_;
  fStack_274 = fStack_250;
  fVar16 = (float)local_258 * -0.0 + local_258._4_4_;
  fVar10 = fStack_250 * 0.0 + local_258._4_4_ * -0.0;
  fVar15 = (float)local_258 * 0.0 + -fStack_250;
  auVar12._0_8_ = CONCAT44(fVar15,fVar10);
  auVar12._8_4_ = fStack_250 * 0.0 + -0.0;
  auVar12._12_4_ = fStack_250 * 0.0 + -0.0;
  fVar17 = local_258._4_4_ * -0.0 + fStack_250;
  fVar19 = fVar15 * fVar15 + fVar16 * fVar16 + fVar10 * fVar10;
  fVar15 = SQRT(fVar19);
  local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_258._4_4_ * 0.0 + -(float)local_258;
  fVar10 = (float)local_258 * 0.0 + fStack_250 * -0.0;
  fVar20 = fVar10 * fVar10 +
           local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] *
           local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] + fVar17 * fVar17;
  fVar18 = SQRT(fVar20);
  if (fVar18 <= fVar15) {
    local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = fVar16;
    if (0.0 < fVar19) {
      local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = fVar16 / fVar15;
      auVar3._4_4_ = fVar15;
      auVar3._0_4_ = fVar15;
      auVar3._8_4_ = fVar15;
      auVar3._12_4_ = fVar15;
      auVar12 = divps(auVar12,auVar3);
    }
  }
  else {
    auVar11._8_4_ = 0;
    auVar11._4_4_ = fVar10;
    auVar11._12_4_ = fStack_250 + 0.0;
    auVar11._0_4_ = fVar17;
    auVar12._0_8_ = auVar11._0_8_;
    if (0.0 < fVar20) {
      local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] / fVar18;
      auVar4._4_4_ = fVar18;
      auVar4._0_4_ = fVar18;
      auVar4._8_4_ = fVar18;
      auVar4._12_4_ = fVar18;
      auVar12 = divps(auVar11,auVar4);
    }
  }
  local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)auVar12._0_8_;
  local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (float)((ulong)auVar12._0_8_ >> 0x20);
  pMVar1 = (XprTypeNested)(auStack_d0 + 0x38);
  uStack_210 = 1;
  local_208 = 3;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e8 = 4;
  local_218 = (undefined1  [8])pMVar1;
  uStack_200 = pMVar1;
  local_258 = &local_270;
  Eigen::internal::
  check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_218,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_258);
  local_27c = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_27c._4_4_,(float)local_27c);
  if ((uStack_210 == 1) &&
     (local_27c = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_27c._4_4_,(float)local_27c),
     local_208 == 3)) {
    lVar9 = 0;
    do {
      (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_218)->m_storage).m_data.array
      [lVar9] = *(float *)((long)(local_258->
                                 super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array + lVar9);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0xc);
    local_258._0_4_ =
         local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] * local_27c._4_4_ -
         fStack_274 *
         local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    local_258._4_4_ =
         local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] * fStack_274 -
         (float)local_27c *
         local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    fStack_250 = (float)local_27c *
                 local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] -
                 local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * local_27c._4_4_;
    local_218 = (undefined1  [8])auStack_94;
    uStack_210 = 1;
    local_208 = 3;
    local_1f8 = 1;
    uStack_1f0 = 0;
    local_1e8 = 4;
    local_260.m_matrix = (non_const_type)&local_258;
    uStack_200 = pMVar1;
    Eigen::internal::
    check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
              ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_218,&local_260);
    local_258 = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_258._4_4_,(float)local_258);
    local_27c = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_27c._4_4_,(float)local_27c);
    if ((uStack_210 == 1) &&
       (local_258 = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_258._4_4_,(float)local_258),
       local_27c = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_27c._4_4_,(float)local_27c),
       local_208 == 3)) {
      lVar9 = 0;
      do {
        (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_218)->m_storage).m_data.
        array[lVar9] = *(float *)((long)((local_260.m_matrix)->
                                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>)
                                        .m_storage.m_data.array + lVar9);
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0xc);
      local_218 = (undefined1  [8])(auStack_94 + 4);
      uStack_210 = 1;
      local_208 = 3;
      local_1f8 = 2;
      uStack_1f0 = 0;
      local_1e8 = 4;
      uStack_200 = pMVar1;
      local_258 = (Matrix<float,_3,_1,_0,_3,_1> *)&local_27c;
      Eigen::internal::
      check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_218,
                 (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_258);
      local_27c = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_27c._4_4_,(float)local_27c);
      if ((uStack_210 == 1) &&
         (local_27c = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_27c._4_4_,(float)local_27c),
         local_208 == 3)) {
        lVar9 = 0;
        do {
          (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_218)->m_storage).m_data.
          array[lVar9] = *(float *)((long)(local_258->
                                          super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                          ).m_storage.m_data.array + lVar9);
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0xc);
        local_218 = (undefined1  [8])(auStack_94 + 0x3c);
        uStack_210 = 3;
        local_1f8 = 0;
        local_1e8 = 4;
        uStack_200 = (XprTypeNested)local_218;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
        normalized((PlainObject *)&local_258,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                   local_218);
        if (CONCAT44(fStack_244,local_248) != 3) goto LAB_0014d226;
        fStack_274 = fStack_250;
        fVar16 = (float)local_258 * -0.0 + local_258._4_4_;
        fVar10 = fStack_250 * 0.0 + local_258._4_4_ * -0.0;
        fVar15 = (float)local_258 * 0.0 + -fStack_250;
        auVar13._0_8_ = CONCAT44(fVar15,fVar10);
        auVar13._8_4_ = fStack_250 * 0.0 + -0.0;
        auVar13._12_4_ = fStack_250 * 0.0 + -0.0;
        fVar17 = local_258._4_4_ * -0.0 + fStack_250;
        fVar18 = fVar15 * fVar15 + fVar16 * fVar16 + fVar10 * fVar10;
        fVar15 = SQRT(fVar18);
        local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = local_258._4_4_ * 0.0 + -(float)local_258;
        fVar10 = (float)local_258 * 0.0 + fStack_250 * -0.0;
        fVar20 = fVar10 * fVar10 +
                 local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] *
                 local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] + fVar17 * fVar17;
        fVar19 = SQRT(fVar20);
        if (fVar19 <= fVar15) {
          local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = fVar16;
          if (0.0 < fVar18) {
            local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = fVar16 / fVar15;
            auVar2._4_4_ = fVar15;
            auVar2._0_4_ = fVar15;
            auVar2._8_4_ = fVar15;
            auVar2._12_4_ = fVar15;
            auVar12 = divps(auVar13,auVar2);
            auVar13._0_8_ = auVar12._0_8_;
          }
        }
        else {
          auVar14._8_4_ = 0;
          auVar14._4_4_ = fVar10;
          auVar14._12_4_ = fStack_250 + 0.0;
          auVar14._0_4_ = fVar17;
          auVar13._0_8_ = auVar14._0_8_;
          if (0.0 < fVar20) {
            local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2] / fVar19;
            auVar5._4_4_ = fVar19;
            auVar5._0_4_ = fVar19;
            auVar5._8_4_ = fVar19;
            auVar5._12_4_ = fVar19;
            auVar12 = divps(auVar14,auVar5);
            auVar13._0_8_ = auVar12._0_8_;
          }
        }
        local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = (float)auVar13._0_8_;
        local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = (float)((ulong)auVar13._0_8_ >> 0x20);
        uStack_210 = 1;
        local_208 = 3;
        local_1f8 = 0;
        uStack_1f0 = 0;
        local_1e8 = 4;
        local_218 = (undefined1  [8])local_d8;
        uStack_200 = (XprTypeNested)local_d8;
        TVar6.m_matrix = &local_270;
        local_27c = local_258;
        Eigen::internal::
        check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                  ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_218,
                   (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_258);
        local_258 = TVar6.m_matrix;
        if ((uStack_210 == 1) && (local_208 == 3)) {
          lVar9 = 0;
          do {
            (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_218)->m_storage).m_data
            .array[lVar9] =
                 *(float *)((long)(local_258->
                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array + lVar9);
            lVar9 = lVar9 + 4;
          } while (lVar9 != 0xc);
          local_258._0_4_ =
               local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * local_27c._4_4_ -
               fStack_274 *
               local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          local_258._4_4_ =
               local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * fStack_274 -
               (float)local_27c *
               local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          fStack_250 = (float)local_27c *
                       local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] -
                       local_270.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0] * local_27c._4_4_;
          local_218 = (undefined1  [8])(local_d8 + 4);
          uStack_210 = 1;
          local_208 = 3;
          local_1f8 = 1;
          uStack_1f0 = 0;
          local_1e8 = 4;
          local_260.m_matrix = (non_const_type)&local_258;
          uStack_200 = (XprTypeNested)local_d8;
          Eigen::internal::
          check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                    ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_218,
                     &local_260);
          local_258 = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_258._4_4_,(float)local_258);
          if ((uStack_210 == 1) &&
             (local_258 = (Matrix<float,_3,_1,_0,_3,_1> *)CONCAT44(local_258._4_4_,(float)local_258)
             , local_208 == 3)) {
            lVar9 = 0;
            do {
              (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_218)->m_storage).
              m_data.array[lVar9] =
                   *(float *)((long)((local_260.m_matrix)->
                                    super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                                    m_storage.m_data.array + lVar9);
              lVar9 = lVar9 + 4;
            } while (lVar9 != 0xc);
            local_218 = (undefined1  [8])auStack_d0;
            uStack_210 = 1;
            local_208 = 3;
            local_1f8 = 2;
            uStack_1f0 = 0;
            local_1e8 = 4;
            uStack_200 = (XprTypeNested)local_d8;
            local_258 = (Matrix<float,_3,_1,_0,_3,_1> *)&local_27c;
            Eigen::internal::
            check_for_aliasing<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
                      ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_218,
                       (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_258);
            if ((uStack_210 == 1) && (local_208 == 3)) {
              lVar9 = 0;
              do {
                (((PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_218)->m_storage).
                m_data.array[lVar9] =
                     *(float *)((long)(local_258->
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                                      m_storage.m_data.array + lVar9);
                lVar9 = lVar9 + 4;
              } while (lVar9 != 0xc);
              (__return_storage_ptr__->
              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              fStack_1e0 = fStack_dc * local_88[10] +
                           fStack_e0 * local_88[6] +
                           fStack_e4 * local_88[2] + local_e8 * (float)auStack_94._4_4_;
              fStack_1dc = fStack_dc * local_88[0xb] +
                           fStack_e0 * local_88[7] + fStack_e4 * local_88[3] + local_e8 * fStack_8c;
              local_218._4_4_ =
                   uStack_190._4_4_ * local_88[9] +
                   (float)uStack_190 * local_88[5] +
                   local_198._4_4_ * local_88[1] + local_118 * (float)auStack_94._0_4_;
              local_218._0_4_ =
                   uStack_190._4_4_ * local_88[8] +
                   (float)uStack_190 * local_88[4] +
                   local_198._4_4_ * local_88[0] + local_118 * (float)auStack_d0._56_4_;
              uStack_210._4_4_ =
                   uStack_190._4_4_ * local_88[0xb] +
                   (float)uStack_190 * local_88[7] +
                   local_198._4_4_ * local_88[3] + local_118 * fStack_8c;
              uStack_210._0_4_ =
                   uStack_190._4_4_ * local_88[10] +
                   (float)uStack_190 * local_88[6] +
                   local_198._4_4_ * local_88[2] + local_118 * (float)auStack_94._4_4_;
              local_208._4_4_ =
                   uStack_180._4_4_ * local_88[9] +
                   (float)uStack_180 * local_88[5] +
                   local_188._4_4_ * local_88[1] + local_108 * (float)auStack_94._0_4_;
              local_208._0_4_ =
                   uStack_180._4_4_ * local_88[8] +
                   (float)uStack_180 * local_88[4] +
                   local_188._4_4_ * local_88[0] + local_108 * (float)auStack_d0._56_4_;
              uStack_200 = (XprTypeNested)
                           CONCAT44(uStack_180._4_4_ * local_88[0xb] +
                                    (float)uStack_180 * local_88[7] +
                                    local_188._4_4_ * local_88[3] + local_108 * fStack_8c,
                                    uStack_180._4_4_ * local_88[10] +
                                    (float)uStack_180 * local_88[6] +
                                    local_188._4_4_ * local_88[2] +
                                    local_108 * (float)auStack_94._4_4_);
              local_1f8._4_4_ =
                   uStack_170._4_4_ * local_88[9] +
                   (float)uStack_170 * local_88[5] +
                   local_178._4_4_ * local_88[1] + local_f8 * (float)auStack_94._0_4_;
              local_1f8._0_4_ =
                   uStack_170._4_4_ * local_88[8] +
                   (float)uStack_170 * local_88[4] +
                   local_178._4_4_ * local_88[0] + local_f8 * (float)auStack_d0._56_4_;
              uStack_1f0._4_4_ =
                   uStack_170._4_4_ * local_88[0xb] +
                   (float)uStack_170 * local_88[7] +
                   local_178._4_4_ * local_88[3] + local_f8 * fStack_8c;
              uStack_1f0._0_4_ =
                   uStack_170._4_4_ * local_88[10] +
                   (float)uStack_170 * local_88[6] +
                   local_178._4_4_ * local_88[2] + local_f8 * (float)auStack_94._4_4_;
              local_1e8 = CONCAT44(fStack_dc * local_88[9] +
                                   fStack_e0 * local_88[5] +
                                   fStack_e4 * local_88[1] + local_e8 * (float)auStack_94._0_4_,
                                   fStack_dc * local_88[8] +
                                   fStack_e0 * local_88[4] +
                                   fStack_e4 * local_88[0] + local_e8 * (float)auStack_d0._56_4_);
              std::
              vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
              ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                        ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                          *)__return_storage_ptr__,(iterator)0x0,
                         (Matrix<float,_4,_4,_0,_4,_4> *)local_218);
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              local_258._0_4_ =
                   uStack_1d0._4_4_ * (float)auStack_d0._40_4_ +
                   (float)uStack_1d0 * (float)auStack_d0._24_4_ +
                   local_1d8._4_4_ * (float)auStack_d0._8_4_ + local_168[4] * (float)local_d8._0_4_;
              local_258._4_4_ =
                   uStack_1d0._4_4_ * (float)auStack_d0._44_4_ +
                   (float)uStack_1d0 * (float)auStack_d0._28_4_ +
                   local_1d8._4_4_ * (float)auStack_d0._12_4_ + local_168[4] * (float)local_d8._4_4_
              ;
              fStack_250 = uStack_1d0._4_4_ * (float)auStack_d0._48_4_ +
                           (float)uStack_1d0 * (float)auStack_d0._32_4_ +
                           local_1d8._4_4_ * (float)auStack_d0._16_4_ +
                           local_168[4] * (float)auStack_d0._0_4_;
              fStack_24c = uStack_1d0._4_4_ * (float)auStack_d0._52_4_ +
                           (float)uStack_1d0 * (float)auStack_d0._36_4_ +
                           local_1d8._4_4_ * (float)auStack_d0._20_4_ +
                           local_168[4] * (float)auStack_d0._4_4_;
              local_248 = uStack_1c0._4_4_ * (float)auStack_d0._40_4_ +
                          (float)uStack_1c0 * (float)auStack_d0._24_4_ +
                          local_1c8._4_4_ * (float)auStack_d0._8_4_ +
                          local_148 * (float)local_d8._0_4_;
              fStack_244 = uStack_1c0._4_4_ * (float)auStack_d0._44_4_ +
                           (float)uStack_1c0 * (float)auStack_d0._28_4_ +
                           local_1c8._4_4_ * (float)auStack_d0._12_4_ +
                           local_148 * (float)local_d8._4_4_;
              fStack_240 = uStack_1c0._4_4_ * (float)auStack_d0._48_4_ +
                           (float)uStack_1c0 * (float)auStack_d0._32_4_ +
                           local_1c8._4_4_ * (float)auStack_d0._16_4_ +
                           local_148 * (float)auStack_d0._0_4_;
              fStack_23c = uStack_1c0._4_4_ * (float)auStack_d0._52_4_ +
                           (float)uStack_1c0 * (float)auStack_d0._36_4_ +
                           local_1c8._4_4_ * (float)auStack_d0._20_4_ +
                           local_148 * (float)auStack_d0._4_4_;
              local_238 = uStack_1b0._4_4_ * (float)auStack_d0._40_4_ +
                          (float)uStack_1b0 * (float)auStack_d0._24_4_ +
                          local_1b8._4_4_ * (float)auStack_d0._8_4_ +
                          local_138 * (float)local_d8._0_4_;
              fStack_234 = uStack_1b0._4_4_ * (float)auStack_d0._44_4_ +
                           (float)uStack_1b0 * (float)auStack_d0._28_4_ +
                           local_1b8._4_4_ * (float)auStack_d0._12_4_ +
                           local_138 * (float)local_d8._4_4_;
              fStack_230 = uStack_1b0._4_4_ * (float)auStack_d0._48_4_ +
                           (float)uStack_1b0 * (float)auStack_d0._32_4_ +
                           local_1b8._4_4_ * (float)auStack_d0._16_4_ +
                           local_138 * (float)auStack_d0._0_4_;
              fStack_22c = uStack_1b0._4_4_ * (float)auStack_d0._52_4_ +
                           (float)uStack_1b0 * (float)auStack_d0._36_4_ +
                           local_1b8._4_4_ * (float)auStack_d0._20_4_ +
                           local_138 * (float)auStack_d0._4_4_;
              local_228 = fStack_11c * (float)auStack_d0._40_4_ +
                          fStack_120 * (float)auStack_d0._24_4_ +
                          fStack_124 * (float)auStack_d0._8_4_ + local_128 * (float)local_d8._0_4_;
              fStack_224 = fStack_11c * (float)auStack_d0._44_4_ +
                           fStack_120 * (float)auStack_d0._28_4_ +
                           fStack_124 * (float)auStack_d0._12_4_ + local_128 * (float)local_d8._4_4_
              ;
              fStack_220 = fStack_11c * (float)auStack_d0._48_4_ +
                           fStack_120 * (float)auStack_d0._32_4_ +
                           fStack_124 * (float)auStack_d0._16_4_ +
                           local_128 * (float)auStack_d0._0_4_;
              fStack_21c = fStack_11c * (float)auStack_d0._52_4_ +
                           fStack_120 * (float)auStack_d0._36_4_ +
                           fStack_124 * (float)auStack_d0._20_4_ +
                           local_128 * (float)auStack_d0._4_4_;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                          ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                            *)__return_storage_ptr__,__position,
                           (Matrix<float,_4,_4,_0,_4,_4> *)&local_258);
              }
              else {
                *(ulong *)(((__position._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 0xc) = CONCAT44(fStack_224,local_228);
                *(ulong *)(((__position._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 0xe) = CONCAT44(fStack_21c,fStack_220);
                *(ulong *)(((__position._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 8) = CONCAT44(fStack_234,local_238);
                *(ulong *)(((__position._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 10) = CONCAT44(fStack_22c,fStack_230);
                *(ulong *)(((__position._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 4) = CONCAT44(fStack_244,local_248);
                *(ulong *)(((__position._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 6) = CONCAT44(fStack_23c,fStack_240);
                *(ulong *)((__position._M_current)->
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                          m_data.array = CONCAT44(local_258._4_4_,(float)local_258);
                *(ulong *)(((__position._M_current)->
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                           m_data.array + 2) = CONCAT44(fStack_24c,fStack_250);
                (__return_storage_ptr__->
                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              return __return_storage_ptr__;
            }
          }
        }
      }
    }
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, 4, 4>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 4, 4>>]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations2Points1Line(Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P2, Matrix<floatPrec, 4,1> P1_B, Matrix<floatPrec, 4,1> P2_B)
{

	// translate frames to P1 and P1_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> P2_1, P2_B1;
	P2_1 = transU * P2;
	P2_B1 = transU_B * P2_B;

	// align Z axis to the direction of P1 -> P2
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = P2_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = P2_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}